

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O2

void __thiscall
Typelib::MemoryLayout::pushInit
          (MemoryLayout *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pushInitGenericOp(this,0,(long)(data->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(data->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->init_ops,
             (const_iterator)
             (this->init_ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void MemoryLayout::pushInit(std::vector<uint8_t> const& data)
{
    pushInitGenericOp(FLAG_INIT, data.size());
    init_ops.insert(init_ops.end(), data.begin(), data.end());
}